

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_literals.c
# Opt level: O3

size_t ZSTD_compressLiterals
                 (ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,ZSTD_strategy strategy,
                 int disableLiteralCompression,void *dst,size_t dstCapacity,void *src,size_t srcSize
                 ,void *entropyWorkspace,size_t entropyWorkspaceSize,int bmi2)

{
  ulong dstCapacity_00;
  ZSTD_hufCTables_t *__dest;
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  size_t dstSize;
  ZSTD_hufCTables_t *dstCapacity_01;
  int iVar8;
  bool bVar9;
  HUF_repeat repeat;
  uint *local_70;
  ZSTD_hufCTables_t *local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  ZSTD_hufCTables_t *local_38;
  
  local_40 = (ulong)(uint)bmi2;
  local_48 = entropyWorkspaceSize;
  bVar2 = 6;
  if (ZSTD_btopt < strategy) {
    bVar2 = (char)strategy - 1;
  }
  uVar7 = srcSize >> (bVar2 & 0x3f);
  local_60 = entropyWorkspace;
  local_70 = (uint *)dst;
  local_58 = dstCapacity;
  local_38 = nextHuf;
  memcpy(nextHuf,prevHuf,0x404);
  __dest = local_38;
  dstCapacity_00 = local_58;
  if (disableLiteralCompression == 0) {
    repeat = prevHuf->repeatMode;
    uVar6 = 0x3f;
    if (repeat == HUF_repeat_valid) {
      uVar6 = 6;
    }
    local_50 = uVar7;
    if (uVar6 < srcSize) {
      uVar7 = ((ulong)(0x3ff < srcSize) - (ulong)(srcSize < 0x4000)) + 4;
      sVar1 = 0xffffffffffffffba;
      dstSize = local_58 - uVar7;
      if (uVar7 <= local_58 && dstSize != 0) {
        bVar9 = repeat == HUF_repeat_valid;
        bVar3 = srcSize < 0x401 && strategy < ZSTD_lazy;
        local_68 = prevHuf;
        if (uVar7 == 3 && bVar9 || srcSize < 0x100) {
          uVar6 = HUF_compress1X_repeat
                            ((void *)((long)local_70 + uVar7),dstSize,src,srcSize,0xff,0xb,local_60,
                             local_48,local_38->CTable,&repeat,(uint)bVar3,(int)local_40);
        }
        else {
          uVar6 = HUF_compress4X_repeat
                            ((void *)((long)local_70 + uVar7),dstSize,src,srcSize,0xff,0xb,local_60,
                             local_48,local_38->CTable,&repeat,(uint)bVar3,(int)local_40);
        }
        uVar4 = 3 - (repeat == HUF_repeat_none);
        if ((uVar6 - 1 < 0xffffffffffffff88) && (uVar6 < (srcSize - local_50) - 2)) {
          if (uVar6 == 1) {
            dstCapacity_01 = local_68;
            memcpy(__dest,local_68,0x404);
            sVar1 = ZSTD_compressRleLiteralsBlock(local_70,(size_t)dstCapacity_01,src,srcSize);
          }
          else {
            if (repeat == HUF_repeat_none) {
              __dest->repeatMode = HUF_repeat_check;
            }
            iVar8 = (int)srcSize;
            iVar5 = (int)uVar6;
            if (uVar7 == 5) {
              *local_70 = iVar5 * 0x400000 + iVar8 * 0x10 | uVar4 | 0xc;
              *(char *)(local_70 + 1) = (char)(uVar6 >> 10);
            }
            else if (uVar7 == 4) {
              *local_70 = iVar5 * 0x40000 + iVar8 * 0x10 | uVar4 | 8;
            }
            else {
              iVar5 = iVar5 * 0x4000 +
                      ((uVar4 | iVar8 * 0x10 + (uint)(uVar7 == 3 && bVar9 || srcSize < 0x100) * 4) ^
                      4);
              *(short *)local_70 = (short)iVar5;
              *(char *)((long)local_70 + 2) = (char)((uint)iVar5 >> 0x10);
            }
            sVar1 = uVar6 + uVar7;
          }
        }
        else {
          memcpy(__dest,local_68,0x404);
          sVar1 = ZSTD_noCompressLiterals(local_70,dstCapacity_00,src,srcSize);
        }
      }
      return sVar1;
    }
  }
  sVar1 = ZSTD_noCompressLiterals(local_70,local_58,src,srcSize);
  return sVar1;
}

Assistant:

size_t ZSTD_compressLiterals (ZSTD_hufCTables_t const* prevHuf,
                              ZSTD_hufCTables_t* nextHuf,
                              ZSTD_strategy strategy, int disableLiteralCompression,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                              void* entropyWorkspace, size_t entropyWorkspaceSize,
                        const int bmi2)
{
    size_t const minGain = ZSTD_minGain(srcSize, strategy);
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i srcSize=%u)",
                disableLiteralCompression, (U32)srcSize);

    /* Prepare nextEntropy assuming reusing the existing table */
    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* small ? don't even attempt compression (speed opt) */
#   define COMPRESS_LITERALS_SIZE_MIN 63
    {   size_t const minLitSize = (prevHuf->repeatMode == HUF_repeat_valid) ? 6 : COMPRESS_LITERALS_SIZE_MIN;
        if (srcSize <= minLitSize) return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const preferRepeat = strategy < ZSTD_lazy ? srcSize <= 1024 : 0;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        cLitSize = singleStream ?
            HUF_compress1X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2) :
            HUF_compress4X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            DEBUGLOG(5, "Reusing previous huffman table");
            hType = set_repeat;
        }
    }

    if ((cLitSize==0) || (cLitSize >= srcSize - minGain) || ERR_isError(cLitSize)) {
        ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }
    if (cLitSize==1) {
        ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        {   U32 const lhc = hType + ((!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)srcSize, (U32)(lhSize+cLitSize));
    return lhSize+cLitSize;
}